

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir.hpp
# Opt level: O3

void __thiscall mir::inst::CallInst::~CallInst(CallInst *this)

{
  ~CallInst(this);
  operator_delete(this,0x50);
  return;
}

Assistant:

virtual ~CallInst() {}